

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

void __thiscall Lexer::skip(Lexer *this,char ch,char left,char right)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  char quote;
  byte bVar9;
  bool bVar10;
  
  if ((ch == left) && (bVar9 = this->yychar, bVar9 != 0)) {
    cVar7 = (char)this + '(';
    iVar8 = 1;
    do {
      std::__cxx11::string::push_back(cVar7);
      pbVar1 = (byte *)(this->yypos)._M_current;
      if (pbVar1 == (byte *)((this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length)) {
        this->yychar = '\0';
        bVar3 = 0;
LAB_0010c762:
        if (bVar9 == ch) {
          iVar8 = iVar8 + 1;
        }
        else if ((bVar9 == right) && (iVar8 = iVar8 + -1, iVar8 == 0)) {
          return;
        }
        if ((bVar9 == 0x27) || (bVar5 = bVar3, bVar9 == 0x22)) {
          while( true ) {
            if (bVar3 == 0) {
              return;
            }
            std::__cxx11::string::push_back(cVar7);
            pbVar1 = (byte *)(this->yypos)._M_current;
            if (pbVar1 == (byte *)((this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length
                                  )) {
              this->yychar = '\0';
              bVar5 = 0;
            }
            else {
              (this->yypos)._M_current = (char *)(pbVar1 + 1);
              bVar5 = *pbVar1;
              this->yychar = bVar5;
              if (bVar5 == 10) {
                this->yylineno = this->yylineno + 1;
                bVar5 = 10;
              }
            }
            if (bVar3 == bVar9) break;
            bVar10 = bVar3 == 0x5c;
            bVar3 = bVar5;
            if (bVar5 != 0 && bVar10) {
              std::__cxx11::string::push_back(cVar7);
              pbVar1 = (byte *)(this->yypos)._M_current;
              if (pbVar1 == (byte *)((this->yycode)._M_dataplus._M_p +
                                    (this->yycode)._M_string_length)) goto LAB_0010c97b;
              (this->yypos)._M_current = (char *)(pbVar1 + 1);
              bVar3 = *pbVar1;
              this->yychar = bVar3;
              if (bVar3 == 10) {
                this->yylineno = this->yylineno + 1;
                bVar3 = 10;
              }
            }
          }
        }
      }
      else {
        (this->yypos)._M_current = (char *)(pbVar1 + 1);
        bVar3 = *pbVar1;
        this->yychar = bVar3;
        if (bVar3 == 10) {
          this->yylineno = this->yylineno + 1;
          bVar3 = 10;
          goto LAB_0010c762;
        }
        if (bVar3 == 0x2f && (bVar9 ^ 0x2f) == 0) {
          bVar5 = 0x2f;
          while ((bVar5 != 0 && (bVar5 != 10))) {
            std::__cxx11::string::push_back(cVar7);
            pbVar1 = (byte *)(this->yypos)._M_current;
            if (pbVar1 == (byte *)((this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length
                                  )) {
              this->yychar = '\0';
              bVar5 = 0;
            }
            else {
              (this->yypos)._M_current = (char *)(pbVar1 + 1);
              bVar5 = *pbVar1;
              this->yychar = bVar5;
              if (bVar5 == 10) {
                this->yylineno = this->yylineno + 1;
                bVar5 = 10;
              }
            }
          }
        }
        else {
          if ((bVar9 ^ 0x2f) != 0 || bVar3 != 0x2a) goto LAB_0010c762;
          std::__cxx11::string::push_back(cVar7);
          pcVar2 = (this->yypos)._M_current;
          if (pcVar2 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
            this->yychar = '\0';
            cVar6 = '\0';
          }
          else {
            (this->yypos)._M_current = pcVar2 + 1;
            cVar6 = *pcVar2;
            this->yychar = cVar6;
            if (cVar6 == '\n') {
              this->yylineno = this->yylineno + 1;
              cVar6 = '\n';
            }
          }
          do {
            if (cVar6 == '\0') {
              return;
            }
            std::__cxx11::string::push_back(cVar7);
            pcVar2 = (this->yypos)._M_current;
            if (pcVar2 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
              this->yychar = '\0';
              cVar4 = '\0';
            }
            else {
              (this->yypos)._M_current = pcVar2 + 1;
              cVar4 = *pcVar2;
              this->yychar = cVar4;
              if (cVar4 == '\n') {
                this->yylineno = this->yylineno + 1;
                cVar4 = '\n';
              }
            }
            bVar10 = cVar6 != '*';
            cVar6 = cVar4;
          } while (cVar4 != '/' || bVar10);
          std::__cxx11::string::push_back(cVar7);
          pbVar1 = (byte *)(this->yypos)._M_current;
          if (pbVar1 == (byte *)((this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length))
          {
LAB_0010c97b:
            this->yychar = '\0';
            return;
          }
          (this->yypos)._M_current = (char *)(pbVar1 + 1);
          bVar5 = *pbVar1;
          this->yychar = bVar5;
          if (bVar5 == 10) {
            this->yylineno = this->yylineno + 1;
            bVar5 = 10;
          }
        }
      }
      bVar9 = bVar5;
    } while (bVar9 != 0);
  }
  return;
}

Assistant:

void Lexer::skip(char ch, char left, char right) {
  if (ch == left) {
    int count = 1;
    auto yynext = [this] {
      yytext += yychar;
      yyinp();
    };
    while (auto ch = yychar) {
      yynext();
      if (ch == '/' && yychar == '/') {
        while (yychar && yychar != '\n') yynext();
        continue;
      }
      if (ch == '/' && yychar == '*') {
        yynext();
        while (auto ch = yychar) {
          yynext();
          if (ch == '*' && yychar == '/') {
            yynext();
            break;
          }
        }
        continue;
      }
      if (ch == left) {
        ++count;
      } else if (ch == right) {
        if (!--count) break;
      }
      if (ch == '"' || ch == '\'') {
        auto quote = ch;
        while (auto ch = yychar) {
          yynext();
          if (ch == quote) break;
          if (ch == '\\' && yychar) yynext();
        }
      }
    }
  }
}